

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.c
# Opt level: O0

int buffsave(buffer *bp)

{
  int iVar1;
  FILE *local_28;
  FILE *ffp;
  buffer *pbStack_18;
  int s;
  buffer *bp_local;
  
  pbStack_18 = bp;
  if ((bp->b_flag & 1U) == 0) {
    ewprintf("(No changes need to be saved)");
    bp_local._4_4_ = 1;
  }
  else if (bp->b_fname[0] == '\0') {
    dobeep();
    ewprintf("No file name");
    bp_local._4_4_ = 0;
  }
  else {
    iVar1 = fchecktime(bp);
    if (iVar1 != 1) {
      iVar1 = eyesno("File has changed on disk since last save. Save anyway");
      if (iVar1 != 1) {
        return iVar1;
      }
      ffp._4_4_ = 1;
    }
    if ((makebackup != 0) && ((pbStack_18->b_flag & 2U) != 0)) {
      ffp._4_4_ = fbackupfile(pbStack_18->b_fname);
      if (ffp._4_4_ == 2) {
        return 0;
      }
      if ((ffp._4_4_ == 0) && (ffp._4_4_ = eyesno("Backup error, save anyway"), ffp._4_4_ != 1)) {
        return ffp._4_4_;
      }
    }
    ffp._4_4_ = writeout(&local_28,pbStack_18,pbStack_18->b_fname);
    if (ffp._4_4_ == 1) {
      fupdstat(pbStack_18);
      pbStack_18->b_flag = pbStack_18->b_flag & 0xfc;
      upmodes(pbStack_18);
      undo_add_boundary(8,1);
      undo_add_modified();
    }
    bp_local._4_4_ = ffp._4_4_;
  }
  return bp_local._4_4_;
}

Assistant:

int
buffsave(struct buffer *bp)
{
	int	 s;
        FILE    *ffp;

	/* return, no changes */
	if ((bp->b_flag & BFCHG) == 0) {
		ewprintf("(No changes need to be saved)");
		return (TRUE);
	}

	/* must have a name */
	if (bp->b_fname[0] == '\0') {
		dobeep();
		ewprintf("No file name");
		return (FALSE);
	}

	/* Ensure file has not been modified elsewhere */
	/* We don't use the ignore flag here */
	if (fchecktime(bp) != TRUE) {
		if ((s = eyesno("File has changed on disk since last save. "
		    "Save anyway")) != TRUE)
			return (s);
	}
	
	if (makebackup && (bp->b_flag & BFBAK)) {
		s = fbackupfile(bp->b_fname);
		/* hard error */
		if (s == ABORT)
			return (FALSE);
		/* softer error */
		if (s == FALSE &&
		    (s = eyesno("Backup error, save anyway")) != TRUE)
			return (s);
	}
	if ((s = writeout(&ffp, bp, bp->b_fname)) == TRUE) {
		(void)fupdstat(bp);
		bp->b_flag &= ~(BFCHG | BFBAK);
		upmodes(bp);
		undo_add_boundary(FFRAND, 1);
		undo_add_modified();
	}
	return (s);
}